

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void countFinalize(sqlite3_context *context)

{
  Mem *pMem;
  i64 *piVar1;
  i64 val;
  
  if ((short)context->pMem->flags < 0) {
    piVar1 = (i64 *)context->pMem->z;
  }
  else {
    piVar1 = (i64 *)createAggContext(context,0);
  }
  if (piVar1 == (i64 *)0x0) {
    val = 0;
  }
  else {
    val = *piVar1;
  }
  pMem = context->pOut;
  if ((pMem->flags & 0x9000) != 0) {
    vdbeReleaseAndSetInt64(pMem,val);
    return;
  }
  (pMem->u).i = val;
  pMem->flags = 4;
  return;
}

Assistant:

static void countFinalize(sqlite3_context *context){
  CountCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  sqlite3_result_int64(context, p ? p->n : 0);
}